

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_line_element.hpp
# Opt level: O1

void __thiscall TextLineElement::~TextLineElement(TextLineElement *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_LineElement)._vptr_LineElement = (_func_int **)&PTR__LineElement_00107978;
  pcVar2 = (this->super_LineElement)._content._M_dataplus._M_p;
  paVar1 = &(this->super_LineElement)._content.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

~TextLineElement() {}